

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * ID(void)

{
  treeNode *this;
  string local_30;
  
  match(ID,lackIdentifiter);
  this = (treeNode *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_30,(string *)&preToken.text);
  treeNode::treeNode(this,idExp,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

treeNode* ID()
{
    match(Token::ID,Error::lackIdentifiter);
    return new treeNode(ExpKind::idExp,preToken.text);
}